

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O2

string * __thiscall
Assimp::(anonymous_namespace)::GetMaterialName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,aiMaterial *mat,uint index)

{
  aiReturn aVar1;
  int iVar2;
  char postfix [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  aiString mat_name;
  
  if (GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                                 underscore_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_,
                 "_",(allocator *)&mat_name);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                           underscore_abi_cxx11_);
    }
  }
  postfix[8] = '\0';
  postfix[9] = '\0';
  postfix[0] = '\0';
  postfix[1] = '\0';
  postfix[2] = '\0';
  postfix[3] = '\0';
  postfix[4] = '\0';
  postfix[5] = '\0';
  postfix[6] = '\0';
  postfix[7] = '\0';
  ASSIMP_itoa10<10ul>(&postfix,(int32_t)mat);
  mat_name.length = 0;
  mat_name.data[0] = '\0';
  memset(mat_name.data + 1,0x1b,0x3ff);
  aVar1 = aiGetMaterialString((aiMaterial *)this,"?mat.name",0,0,&mat_name);
  if (aVar1 == aiReturn_SUCCESS) {
    std::operator+(&local_440,mat_name.data,
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_);
    std::operator+(__return_storage_ptr__,&local_440,postfix);
  }
  else {
    std::operator+(&local_440,"Material",
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_);
    std::operator+(__return_storage_ptr__,&local_440,postfix);
  }
  std::__cxx11::string::~string((string *)&local_440);
  return __return_storage_ptr__;
}

Assistant:

std::string GetMaterialName(const aiMaterial& mat, unsigned int index) {
        static const std::string underscore = "_";
        char postfix[10] = {0};
        ASSIMP_itoa10(postfix, index);

        aiString mat_name;
        if (AI_SUCCESS == mat.Get(AI_MATKEY_NAME, mat_name)) {
            return mat_name.C_Str() + underscore + postfix;
        }

        return "Material" + underscore + postfix;
    }